

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicswidget_p.cpp
# Opt level: O2

void __thiscall QGraphicsWidgetPrivate::updateFont(QGraphicsWidgetPrivate *this,QFont *font)

{
  uint uVar1;
  uint uVar2;
  QGraphicsItem *pQVar3;
  QGraphicsItemPrivate *pQVar4;
  bool bVar5;
  QGraphicsItem *this_00;
  int i;
  ulong uVar6;
  long in_FS_OFFSET;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = (this->super_QGraphicsItemPrivate).q_ptr;
  this_00 = pQVar3 + -1;
  if (pQVar3 == (QGraphicsItem *)0x0) {
    this_00 = (QGraphicsItem *)0x0;
  }
  QFont::operator=(&this->font,font);
  bVar5 = QGraphicsItem::isWindow(this_00 + 1);
  if (bVar5) {
    bVar5 = QGraphicsWidget::testAttribute((QGraphicsWidget *)this_00,WA_WindowPropagation);
    if (!bVar5) {
      this->inheritedFontResolveMask = 0;
    }
  }
  uVar1 = this->inheritedFontResolveMask;
  uVar2 = *(uint *)(font + 8);
  uVar6 = 0;
  do {
    if ((ulong)(this->super_QGraphicsItemPrivate).children.d.size <= uVar6) {
      if ((this->field_0x1b5 & 8) != 0) {
        local_48 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
        QEvent::QEvent((QEvent *)&local_48,FontChange);
        QCoreApplication::sendEvent((QObject *)this_00,(QEvent *)&local_48);
        QEvent::~QEvent((QEvent *)&local_48);
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return;
      }
      __stack_chk_fail();
    }
    pQVar3 = (this->super_QGraphicsItemPrivate).children.d.ptr[uVar6];
    bVar5 = QGraphicsItem::isWidget(pQVar3);
    if (bVar5) {
      bVar5 = QGraphicsItem::isWindow(pQVar3);
      if (!bVar5) goto LAB_005c9fd9;
      bVar5 = QGraphicsWidget::testAttribute((QGraphicsWidget *)(pQVar3 + -1),WA_WindowPropagation);
      if (bVar5) goto LAB_005c9fd9;
    }
    else {
LAB_005c9fd9:
      pQVar4 = (pQVar3->d_ptr).d;
      (*pQVar4->_vptr_QGraphicsItemPrivate[5])(pQVar4,(ulong)(uVar1 | uVar2));
    }
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

void QGraphicsWidgetPrivate::updateFont(const QFont &font)
{
    Q_Q(QGraphicsWidget);
    // Update the local font setting.
    this->font = font;

    // Calculate new mask.
    if (q->isWindow() && !q->testAttribute(Qt::WA_WindowPropagation))
        inheritedFontResolveMask = 0;
    int mask = font.resolveMask() | inheritedFontResolveMask;

    // Propagate to children.
    for (int i = 0; i < children.size(); ++i) {
        QGraphicsItem *item = children.at(i);
        if (item->isWidget()) {
            QGraphicsWidget *w = static_cast<QGraphicsWidget *>(item);
            if (!w->isWindow() || w->testAttribute(Qt::WA_WindowPropagation))
                w->d_func()->resolveFont(mask);
        } else {
            item->d_ptr->resolveFont(mask);
        }
    }

    if (!polished)
        return;
    // Notify change.
    QEvent event(QEvent::FontChange);
    QCoreApplication::sendEvent(q, &event);
}